

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook.cc
# Opt level: O0

void __thiscall
base::internal::HookList<void_(*)(const_void_*)>::FixupPrivEndLocked
          (HookList<void_(*)(const_void_*)> *this)

{
  atomic<void_(*)(const_void_*)> *this_00;
  __pointer_type p_Var1;
  bool bVar2;
  __int_type local_50;
  uintptr_t hooks_end;
  HookList<void_(*)(const_void_*)> *this_local;
  memory_order __b;
  memory_order __b_1;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  local_50 = (this->priv_end).super___atomic_base<unsigned_long>._M_i;
  while( true ) {
    bVar2 = false;
    if (local_50 != 0) {
      this_00 = cast_priv_data(this,(int)local_50 + -1);
      p_Var1 = std::atomic<void_(*)(const_void_*)>::load(this_00,memory_order_relaxed);
      bVar2 = p_Var1 == (__pointer_type)0x0;
    }
    if (!bVar2) break;
    local_50 = local_50 - 1;
  }
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->priv_end).super___atomic_base<unsigned_long>._M_i = local_50;
  return;
}

Assistant:

void HookList<T>::FixupPrivEndLocked() {
  uintptr_t hooks_end = priv_end.load(std::memory_order_relaxed);
  while ((hooks_end > 0) &&
         cast_priv_data(hooks_end-1)->load(std::memory_order_relaxed) == 0) {
    --hooks_end;
  }
  priv_end.store(hooks_end, std::memory_order_relaxed);
}